

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O3

int AF_A_KoraxDecide(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  FState *newstate;
  AActor *this;
  VMValue *pVVar7;
  FName *label;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  FName local_30;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e50d1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (AActor *)0x0) {
LAB_005e4f94:
        this = (AActor *)0x0;
        pVVar7 = param;
        uVar5 = numparam;
      }
      else {
        pPVar6 = (this->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
          (this->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar8 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        bVar9 = pPVar6 == pPVar3;
        if (!bVar9 && !bVar8) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
        uVar5 = (uint)bVar8;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e50d1;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e5054;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e50c1;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
              puVar2[1] = pPVar6;
            }
            bVar8 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar3 && bVar8) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar8 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar3) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e50d1;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e50c1;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e5054:
        uVar5 = FRandom::GenRand32(&pr_koraxdecide);
        if ((uVar5 & 0xfc) < 0xdc) {
          iVar4 = FName::NameManager::FindName(&FName::NameData,"Attack",false);
          label = &local_2c;
        }
        else {
          iVar4 = FName::NameManager::FindName(&FName::NameData,"Command",false);
          label = &local_30;
        }
        label->Index = iVar4;
        newstate = AActor::FindState(this,label);
        AActor::SetState(this,newstate,false);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e50d1;
    }
    if (this == (AActor *)0x0) goto LAB_005e4f94;
  }
LAB_005e50c1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e50d1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0xcc,"int AF_A_KoraxDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxDecide)
{
	PARAM_ACTION_PROLOGUE;

	if (pr_koraxdecide()<220)
	{
		self->SetState (self->FindState("Attack"));
	}
	else
	{
		self->SetState (self->FindState("Command"));
	}
	return 0;
}